

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

char * GmfReadByteFlow(int64_t MshIdx,int *NmbByt)

{
  undefined4 uVar1;
  ulong MshIdx_00;
  undefined8 in_RSI;
  int64_t in_RDI;
  GmfMshSct *msh;
  size_t NmbWrd;
  size_t i;
  int *WrdTab;
  int cod;
  int64_t iVar2;
  ulong local_30;
  char *local_8;
  
  iVar2 = in_RDI;
  MshIdx_00 = GmfStatKwd(in_RDI,0x7e);
  if (MshIdx_00 == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)malloc(MshIdx_00 << 2);
    if (local_8 == (char *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      uVar1 = *(undefined4 *)(iVar2 + 0x10);
      *(undefined4 *)(iVar2 + 0x10) = 1;
      GmfGotoKwd(MshIdx_00,(int)((ulong)iVar2 >> 0x20));
      GmfGetLin(in_RDI,0x7e,in_RSI);
      for (local_30 = 0; local_30 < MshIdx_00; local_30 = local_30 + 1) {
        GmfGetLin(in_RDI,0x7e,local_8 + local_30 * 4);
      }
      *(undefined4 *)(iVar2 + 0x10) = uVar1;
    }
  }
  return local_8;
}

Assistant:

char *GmfReadByteFlow(int64_t MshIdx, int *NmbByt)
{
   int         cod, *WrdTab;
   size_t      i, NmbWrd;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;

   // Read and allocate the number of 4-byte words in the byteflow
   if(!(NmbWrd = GmfStatKwd(MshIdx, GmfByteFlow)))
      return(NULL);

   if(!(WrdTab = malloc(NmbWrd * WrdSiz)))
      return(NULL);

   // Disable the endianess conversion
   cod = msh->cod;
   msh->cod = 1;

   // Read the exact number of bytes in the byteflow
   GmfGotoKwd(MshIdx, GmfByteFlow);
   GmfGetLin(MshIdx, GmfByteFlow, NmbByt);

   // Read the byteflow as 4-byte blocks
   for(i=0;i<NmbWrd;i++)
      GmfGetLin(MshIdx, GmfByteFlow, &WrdTab[i]);

   // Enable endianess convertion
   msh->cod = cod;

   return((char *)WrdTab);
}